

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

void * hash_table_delete_bkey(hash_table_t *h,char *key,size_t len)

{
  uint32 hash_00;
  char *key_00;
  void *pvVar1;
  char *str;
  uint32 hash;
  size_t len_local;
  char *key_local;
  hash_table_t *h_local;
  
  key_00 = makekey((uint8 *)key,len,(char *)0x0);
  hash_00 = key2hash(h,key_00);
  ckd_free(key_00);
  pvVar1 = delete(h,hash_00,key,len);
  return pvVar1;
}

Assistant:

void *
hash_table_delete_bkey(hash_table_t * h, const char *key, size_t len)
{
    uint32 hash;
    char *str;

    str = makekey((uint8 *) key, len, NULL);
    hash = key2hash(h, str);
    ckd_free(str);

    return (delete(h, hash, key, len));
}